

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O3

TokenList * slang::syntax::deepClone(TokenList *node,BumpAllocator *alloc)

{
  size_t sVar1;
  int iVar2;
  undefined4 extraout_var;
  TokenList *pTVar3;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  Info *extraout_RDX_01;
  long lVar4;
  Token *ele;
  pointer this;
  SmallVector<slang::parsing::Token,_2UL> buffer;
  Token local_70;
  SmallVector<slang::parsing::Token,_2UL> local_60;
  
  SmallVector<slang::parsing::Token,_2UL>::SmallVector
            (&local_60,
             (node->super_span<slang::parsing::Token,_18446744073709551615UL>)._M_extent.
             _M_extent_value);
  sVar1 = (node->super_span<slang::parsing::Token,_18446744073709551615UL>)._M_extent.
          _M_extent_value;
  src = extraout_RDX;
  if (sVar1 != 0) {
    this = (node->super_span<slang::parsing::Token,_18446744073709551615UL>)._M_ptr;
    lVar4 = sVar1 << 4;
    do {
      local_70 = parsing::Token::deepClone(this,alloc);
      SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token>
                (&local_60.super_SmallVectorBase<slang::parsing::Token>,&local_70);
      this = this + 1;
      lVar4 = lVar4 + -0x10;
      src = extraout_RDX_00;
    } while (lVar4 != 0);
  }
  iVar2 = SmallVectorBase<slang::parsing::Token>::copy
                    (&local_60.super_SmallVectorBase<slang::parsing::Token>,(EVP_PKEY_CTX *)alloc,
                     src);
  local_70.rawLen = extraout_var;
  local_70.kind = (short)iVar2;
  local_70._2_1_ = (char)((uint)iVar2 >> 0x10);
  local_70.numFlags.raw = (char)((uint)iVar2 >> 0x18);
  local_70.info = extraout_RDX_01;
  pTVar3 = BumpAllocator::
           emplace<slang::syntax::TokenList,std::span<slang::parsing::Token,18446744073709551615ul>>
                     (alloc,(span<slang::parsing::Token,_18446744073709551615UL> *)&local_70);
  if (local_60.super_SmallVectorBase<slang::parsing::Token>.data_ !=
      (pointer)local_60.super_SmallVectorBase<slang::parsing::Token>.firstElement) {
    operator_delete(local_60.super_SmallVectorBase<slang::parsing::Token>.data_);
  }
  return pTVar3;
}

Assistant:

inline TokenList* deepClone(const TokenList& node, BumpAllocator& alloc) {
    SmallVector<parsing::Token> buffer(node.size(), UninitializedTag());
    for (const auto& ele : node) {
        buffer.push_back(ele.deepClone(alloc));
    }
    return alloc.emplace<TokenList>(buffer.copy(alloc));
}